

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O2

Ptr<Swapchain> __thiscall
myvk::Swapchain::Create
          (Swapchain *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,VkImageUsageFlags image_usage)

{
  VkPresentModeKHR VVar1;
  VkPhysicalDevice pVVar2;
  VkSurfaceKHR pVVar3;
  PFN_vkCreateSwapchainKHR p_Var4;
  PFN_vkGetSwapchainImagesKHR p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  VkResult VVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pVVar9;
  long lVar10;
  uint uVar11;
  pointer pVVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkFormat VVar13;
  int *piVar14;
  VkSwapchainCreateInfoKHR *pVVar15;
  VkColorSpaceKHR VVar16;
  VkPresentModeKHR VVar17;
  bool bVar18;
  byte bVar19;
  Ptr<Swapchain> PVar20;
  uint32_t present_mode_count;
  uint32_t format_count;
  shared_ptr<myvk::Swapchain> ret;
  int height;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> surface_formats;
  VkSurfaceCapabilitiesKHR capabilities;
  uint32_t local_a0 [2];
  int width;
  undefined4 uStack_94;
  void *pvStack_90;
  undefined8 local_88;
  VkSurfaceKHR pVStack_80;
  uint local_78;
  VkFormat VStack_74;
  VkColorSpaceKHR VStack_70;
  uint uStack_6c;
  uint local_68;
  uint32_t uStack_64;
  ulong uStack_60;
  ulong local_58;
  uint32_t *local_50;
  VkSurfaceTransformFlagBitsKHR local_48;
  VkCompositeAlphaFlagBitsKHR local_44;
  VkPresentModeKHR local_40;
  VkBool32 local_3c;
  VkSwapchainKHR local_38;
  
  bVar19 = 0;
  std::make_shared<myvk::Swapchain>();
  std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_graphics_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>,
             &graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>,
             &present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>);
  iVar7 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar2 = *(VkPhysicalDevice *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar7) + 0x18) + 0x28);
  pVVar3 = ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_surface;
  surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)(pVVar2,pVVar3,&capabilities);
  (*vkGetPhysicalDeviceSurfaceFormatsKHR)(pVVar2,pVVar3,&format_count,(VkSurfaceFormatKHR *)0x0);
  if ((ulong)format_count != 0) {
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::resize
              (&surface_formats,(ulong)format_count);
    (*vkGetPhysicalDeviceSurfaceFormatsKHR)
              (pVVar2,pVVar3,&format_count,
               surface_formats.
               super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  (*vkGetPhysicalDeviceSurfacePresentModesKHR)
            (pVVar2,pVVar3,&present_mode_count,(VkPresentModeKHR *)0x0);
  if ((ulong)present_mode_count != 0) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              (&present_modes,(ulong)present_mode_count);
    (*vkGetPhysicalDeviceSurfacePresentModesKHR)
              (pVVar2,pVVar3,&present_mode_count,
               present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     (present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start !=
      present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    VVar16 = (surface_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
              super__Vector_impl_data._M_start)->colorSpace;
    pVVar12 = surface_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
              super__Vector_impl_data._M_start;
    VVar13 = VK_FORMAT_B8G8R8A8_UNORM;
    if ((long)surface_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)surface_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
              super__Vector_impl_data._M_start != 8 ||
        (surface_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
         ._M_impl.super__Vector_impl_data._M_start)->format != VK_FORMAT_UNDEFINED) {
      for (; VVar13 = (surface_formats.
                       super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                       _M_impl.super__Vector_impl_data._M_start)->format,
          pVVar12 !=
          surface_formats.
          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
          super__Vector_impl_data._M_finish; pVVar12 = pVVar12 + 1) {
        if (pVVar12->format == VK_FORMAT_B8G8R8A8_UNORM) {
          VVar16 = pVVar12->colorSpace;
          VVar13 = VK_FORMAT_B8G8R8A8_UNORM;
          break;
        }
      }
    }
    if (use_vsync) {
      VVar17 = VK_PRESENT_MODE_FIFO_KHR;
    }
    else {
      VVar17 = VK_PRESENT_MODE_MAILBOX_KHR;
      pVVar9 = present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pVVar9 == present_modes.
                      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          VVar17 = VK_PRESENT_MODE_IMMEDIATE_KHR;
          break;
        }
        VVar1 = *pVVar9;
        pVVar9 = pVVar9 + 1;
      } while (VVar1 != VK_PRESENT_MODE_MAILBOX_KHR);
    }
    if (capabilities.currentExtent.width == 0xffffffff) {
      glfwGetWindowSize(((((present_queue->
                           super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_surface_ptr).
                         super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        m_window,&width,&height);
      capabilities.currentExtent.width = capabilities.maxImageExtent.width;
      if ((uint)width < capabilities.maxImageExtent.width) {
        capabilities.currentExtent.width = width;
      }
      if (capabilities.currentExtent.width < capabilities.minImageExtent.width) {
        capabilities.currentExtent.width = capabilities.minImageExtent.width;
      }
      if ((uint)height < capabilities.maxImageExtent.height) {
        capabilities.maxImageExtent.height = height;
      }
      capabilities.currentExtent.height = capabilities.maxImageExtent.height;
      if (capabilities.maxImageExtent.height < capabilities.minImageExtent.height) {
        capabilities.currentExtent.height = capabilities.minImageExtent.height;
      }
    }
    uVar11 = capabilities.minImageCount + 1;
    local_78 = capabilities.maxImageCount;
    if (uVar11 < capabilities.maxImageCount) {
      local_78 = uVar11;
    }
    if (capabilities.maxImageCount == 0) {
      local_78 = uVar11;
    }
    pvStack_90 = (void *)0x0;
    local_88._0_4_ = 0;
    local_88._4_4_ = 0;
    width = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    uStack_94 = 0;
    pVStack_80 = pVVar3;
    VStack_74 = VVar13;
    uStack_6c = capabilities.currentExtent.width;
    VStack_70 = VVar16;
    uStack_64 = 1;
    local_68 = capabilities.currentExtent.height;
    bVar18 = ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_Queue).m_unique_queue_ptr.
              super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_family_index !=
             ((((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->m_unique_queue_ptr).
              super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_family_index;
    local_50 = local_a0;
    if (!bVar18) {
      local_50 = (uint32_t *)0x0;
    }
    uStack_60 = (ulong)CONCAT14(bVar18,image_usage);
    local_58 = (ulong)((uint)bVar18 * 2);
    local_48 = capabilities.currentTransform;
    local_44 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    local_40 = VVar17;
    local_3c = 1;
    local_38 = (VkSwapchainKHR)0x0;
    piVar14 = &width;
    pVVar15 = &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_swapchain_create_info;
    for (lVar10 = 0xd; p_Var4 = vkCreateSwapchainKHR, lVar10 != 0; lVar10 = lVar10 + -1) {
      iVar7 = piVar14[1];
      pVVar15->sType = piVar14[0];
      *(int *)&pVVar15->field_0x4 = iVar7;
      piVar14 = piVar14 + (ulong)bVar19 * -4 + 2;
      pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar19 * -0x10 + 8);
    }
    iVar7 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    VVar8 = (*p_Var4)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x268),
                      (VkSwapchainCreateInfoKHR *)&width,(VkAllocationCallbacks *)0x0,
                      &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_swapchain);
    p_Var5 = vkGetSwapchainImagesKHR;
    if (VVar8 == VK_SUCCESS) {
      iVar7 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      (*p_Var5)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x268),
                (ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_swapchain,
                &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_image_count,(VkImage *)0x0);
      _Var6 = ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DeviceObjectBase).super_Base._vptr_Base =
           (_func_int **)ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var6._M_pi;
      ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_00191ad9;
    }
  }
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
  (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_00191ad9:
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
            (&present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>)
  ;
  std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
            (&surface_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar20.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar20.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Swapchain>)PVar20.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue,
                                 bool use_vsync, VkImageUsageFlags image_usage) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = graphics_queue;
	ret->m_present_queue_ptr = present_queue;

	VkPhysicalDevice physical_device = graphics_queue->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();
	VkSurfaceKHR surface = present_queue->GetSurfacePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	std::vector<VkSurfaceFormatKHR> surface_formats;
	std::vector<VkPresentModeKHR> present_modes;

	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, surface, &capabilities);

	uint32_t format_count;
	vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, nullptr);
	if (format_count != 0) {
		surface_formats.resize(format_count);
		vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, surface_formats.data());
	}
	uint32_t present_mode_count;
	vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, nullptr);
	if (present_mode_count != 0) {
		present_modes.resize(present_mode_count);
		vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, present_modes.data());
	}
	if (surface_formats.empty() || present_modes.empty())
		return nullptr;

	// select surface format
	VkSurfaceFormatKHR surface_format = surface_formats.front();
	if (surface_formats.size() == 1 && surface_formats.front().format == VK_FORMAT_UNDEFINED)
		surface_format.format = VK_FORMAT_B8G8R8A8_UNORM;
	else {
		for (const auto &i : surface_formats)
			if (i.format == VK_FORMAT_B8G8R8A8_UNORM) {
				surface_format = i;
				break;
			}
	}

	// select present mode
	VkPresentModeKHR present_mode = VK_PRESENT_MODE_FIFO_KHR;
	if (!use_vsync) {
		present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
		for (const auto &i : present_modes)
			if (i == VK_PRESENT_MODE_MAILBOX_KHR) {
				present_mode = i;
				break;
			}
	}

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(present_queue->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// query image count
	uint32_t image_count = capabilities.minImageCount + 1u;
	if (capabilities.maxImageCount > 0 && image_count > capabilities.maxImageCount)
		image_count = capabilities.maxImageCount;

	// create swapchain
	VkSwapchainCreateInfoKHR create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.surface = surface;
	create_info.minImageCount = image_count;
	create_info.imageFormat = surface_format.format;
	create_info.imageColorSpace = surface_format.colorSpace;
	create_info.imageExtent = extent;
	create_info.imageArrayLayers = 1;
	create_info.imageUsage = image_usage;

	if (present_queue->GetFamilyIndex() != graphics_queue->GetFamilyIndex()) {
		uint32_t queue_family_indices[] = {graphics_queue->GetFamilyIndex(), present_queue->GetFamilyIndex()};
		create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
		create_info.queueFamilyIndexCount = 2;
		create_info.pQueueFamilyIndices = queue_family_indices;
	} else {
		create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
		create_info.queueFamilyIndexCount = 0;
		create_info.pQueueFamilyIndices = nullptr;
	}
	create_info.preTransform = capabilities.currentTransform;
	create_info.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
	create_info.presentMode = present_mode;
	create_info.clipped = VK_TRUE;
	create_info.oldSwapchain = VK_NULL_HANDLE;

	// set constants
	ret->m_swapchain_create_info = create_info;

	if (vkCreateSwapchainKHR(graphics_queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(graphics_queue->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count,
	                        nullptr);

	return ret;
}